

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall
Catch::Detail::CaseInsensitiveLess::operator()
          (CaseInsensitiveLess *this,StringRef lhs,StringRef rhs)

{
  bool bVar1;
  const_iterator pcVar2;
  const_iterator pcVar3;
  const_iterator pcVar4;
  const_iterator pcVar5;
  StringRef local_20;
  StringRef local_10;
  
  pcVar2 = StringRef::begin(&local_10);
  pcVar3 = StringRef::end(&local_10);
  pcVar4 = StringRef::begin(&local_20);
  pcVar5 = StringRef::end(&local_20);
  bVar1 = std::operator()(pcVar2,pcVar3,pcVar4,pcVar5);
  return bVar1;
}

Assistant:

bool CaseInsensitiveLess::operator()( StringRef lhs,
                                              StringRef rhs ) const {
            return std::lexicographical_compare(
                lhs.begin(), lhs.end(),
                rhs.begin(), rhs.end(),
                []( char l, char r ) { return toLower( l ) < toLower( r ); } );
        }